

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::UTF8CollationIterator::nextCodePoint(UTF8CollationIterator *this,UErrorCode *param_1)

{
  byte bVar1;
  int iVar2;
  byte local_25;
  uint local_24;
  uint8_t __t;
  UChar32 c;
  UErrorCode *param_1_local;
  UTF8CollationIterator *this_local;
  
  if (this->pos == this->length) {
    return -1;
  }
  if ((this->u8[this->pos] == '\0') && (this->length < 0)) {
    this->length = this->pos;
    return -1;
  }
  iVar2 = this->pos;
  this->pos = iVar2 + 1;
  local_24 = (uint)this->u8[iVar2];
  if ((this->u8[iVar2] & 0x80) == 0) {
    return local_24;
  }
  if (this->pos == this->length) {
    return 0xfffd;
  }
  if (local_24 < 0xe0) {
    if (local_24 < 0xc2) {
      return 0xfffd;
    }
    local_24 = local_24 & 0x1f;
  }
  else {
    if (local_24 < 0xf0) {
      local_24 = local_24 & 0xf;
      if (((int)" 000000000000\x1000"[(int)local_24] &
          1 << (sbyte)((int)(uint)this->u8[this->pos] >> 5)) == 0) {
        return 0xfffd;
      }
      local_25 = this->u8[this->pos] & 0x3f;
    }
    else {
      iVar2 = local_24 - 0xf0;
      if (4 < iVar2) {
        return 0xfffd;
      }
      if (((int)""[(int)(uint)this->u8[this->pos] >> 4] & 1 << ((byte)iVar2 & 0x1f)) == 0) {
        return 0xfffd;
      }
      local_24 = iVar2 * 0x40 | this->u8[this->pos] & 0x3f;
      iVar2 = this->pos + 1;
      this->pos = iVar2;
      if (iVar2 == this->length) {
        return 0xfffd;
      }
      local_25 = this->u8[this->pos] + 0x80;
      if (0x3f < local_25) {
        return 0xfffd;
      }
    }
    local_24 = local_24 << 6 | (uint)local_25;
    iVar2 = this->pos + 1;
    this->pos = iVar2;
    if (iVar2 == this->length) {
      return 0xfffd;
    }
  }
  bVar1 = this->u8[this->pos] + 0x80;
  if (0x3f < bVar1) {
    return 0xfffd;
  }
  this->pos = this->pos + 1;
  return local_24 << 6 | (uint)bVar1;
}

Assistant:

UChar32
UTF8CollationIterator::nextCodePoint(UErrorCode & /*errorCode*/) {
    if(pos == length) {
        return U_SENTINEL;
    }
    if(u8[pos] == 0 && length < 0) {
        length = pos;
        return U_SENTINEL;
    }
    UChar32 c;
    U8_NEXT_OR_FFFD(u8, pos, length, c);
    return c;
}